

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O0

Result __thiscall
soplex::SPxMainSM<double>::simplify
          (SPxMainSM<double> *this,SPxLPBase<double> *lp,Real remainingTime,bool keepbounds,
          uint32_t seed)

{
  double dVar1;
  SPxSense SVar2;
  int iVar3;
  Verbosity VVar4;
  int iVar5;
  int iVar6;
  Result RVar7;
  ulong *puVar8;
  double *pdVar9;
  element_type *peVar10;
  int *piVar11;
  SPxOut *manip;
  SPxOut *_spxout;
  byte in_DL;
  SPxLPBase<double> *in_RSI;
  long in_RDI;
  bool bVar12;
  SPxLPBase<double> *in_stack_00000058;
  SPxMainSM<double> *in_stack_00000060;
  SPxLPBase<double> *in_stack_000001b8;
  SPxMainSM<double> *in_stack_000001c0;
  Verbosity old_verbosity_8;
  Verbosity old_verbosity_7;
  int j_2;
  int i_2;
  int numEqualities_1;
  int numBoxedCols_1;
  int numRangedRows_1;
  Verbosity old_verbosity_6;
  Verbosity old_verbosity_5;
  Verbosity old_verbosity_4;
  Verbosity old_verbosity_3;
  Verbosity old_verbosity_2;
  Verbosity old_verbosity_1;
  int j_1;
  int i_1;
  int k;
  int j;
  int i;
  int numEqualities;
  int numBoxedCols;
  int numRangedRows;
  Verbosity old_verbosity;
  int nrounds;
  bool again;
  bool *in_stack_000003b8;
  SPxLPBase<double> *in_stack_000003c0;
  SPxMainSM<double> *in_stack_000003c8;
  bool *in_stack_00000480;
  SPxLPBase<double> *in_stack_00000488;
  SPxMainSM<double> *in_stack_00000490;
  bool *in_stack_000005f8;
  SPxLPBase<double> *in_stack_00000600;
  SPxMainSM<double> *in_stack_00000608;
  bool *in_stack_00000618;
  SPxLPBase<double> *in_stack_00000620;
  SPxMainSM<double> *in_stack_00000628;
  bool *in_stack_00000708;
  SPxLPBase<double> *in_stack_00000710;
  SPxMainSM<double> *in_stack_00000718;
  SPxSimplifier<double> *in_stack_fffffffffffffd58;
  SPxLPBase<double> *in_stack_fffffffffffffd60;
  SPxLPBase<double> *in_stack_fffffffffffffd70;
  undefined8 in_stack_fffffffffffffd88;
  VectorBase<double> *in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  SPxMainSM<double> *in_stack_fffffffffffffe30;
  undefined4 local_dc;
  Verbosity local_d8 [3];
  int local_cc;
  int local_b4;
  int local_b0;
  int local_ac;
  int local_a8;
  undefined4 local_a4;
  Verbosity local_a0 [3];
  undefined4 local_94;
  Verbosity local_90 [3];
  Verbosity local_84;
  Verbosity local_80 [3];
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  SPxLPBase<double> *in_stack_ffffffffffffffa8;
  SPxMainSM<double> *in_stack_ffffffffffffffb0;
  int local_48;
  undefined4 local_38;
  Verbosity local_34;
  int local_30;
  byte local_29;
  byte local_21;
  Result local_4;
  
  local_21 = in_DL & 1;
  *(SPxOut **)(in_RDI + 0x48) = in_RSI->spxout;
  SVar2 = SPxLPBase<double>::spxSense(in_RSI);
  *(SPxSense *)(in_RDI + 0x1b8) = SVar2;
  (**(code **)(**(long **)(in_RDI + 0x10) + 0x10))();
  (**(code **)(**(long **)(in_RDI + 0x10) + 0x18))();
  *(undefined8 *)(in_RDI + 0x38) = 0;
  puVar8 = (ulong *)infinity();
  *(ulong *)(in_RDI + 0x1c8) = *puVar8 ^ 0x8000000000000000;
  puVar8 = (ulong *)infinity();
  *(ulong *)(in_RDI + 0x1d0) = *puVar8 ^ 0x8000000000000000;
  *(undefined4 *)(in_RDI + 0x1c) = 0;
  *(undefined4 *)(in_RDI + 0x20) = 0;
  *(undefined4 *)(in_RDI + 0x24) = 0;
  *(undefined4 *)(in_RDI + 0x28) = 0;
  *(undefined4 *)(in_RDI + 0x2c) = 0;
  *(undefined4 *)(in_RDI + 0x30) = 0;
  *(undefined4 *)(in_RDI + 0x34) = 0;
  *(undefined4 *)(in_RDI + 0x1c4) = 0;
  local_29 = 1;
  local_30 = 0;
  iVar3 = Array<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>::size
                    ((Array<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_> *)0x26412b);
  if (0 < iVar3) {
    Array<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>::clear
              ((Array<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_> *)0x264144);
  }
  Array<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>::reSize
            ((Array<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_> *)
             in_stack_fffffffffffffd60,(int)((ulong)in_stack_fffffffffffffd58 >> 0x20));
  *(undefined1 *)(in_RDI + 0x198) = 0;
  if ((*(long *)(in_RDI + 0x48) != 0) &&
     (VVar4 = SPxOut::getVerbosity(*(SPxOut **)(in_RDI + 0x48)), 3 < (int)VVar4)) {
    local_34 = SPxOut::getVerbosity(*(SPxOut **)(in_RDI + 0x48));
    local_38 = 4;
    (**(code **)(**(long **)(in_RDI + 0x48) + 0x10))(*(long **)(in_RDI + 0x48),&local_38);
    for (local_48 = 0; iVar3 = SPxLPBase<double>::nRows((SPxLPBase<double> *)0x26421a),
        local_48 < iVar3; local_48 = local_48 + 1) {
      pdVar9 = SPxLPBase<double>::lhs
                         (in_stack_fffffffffffffd60,(int)((ulong)in_stack_fffffffffffffd58 >> 0x20))
      ;
      dVar1 = *pdVar9;
      pdVar9 = (double *)infinity();
      if (-*pdVar9 < dVar1) {
        pdVar9 = SPxLPBase<double>::rhs
                           (in_stack_fffffffffffffd60,
                            (int)((ulong)in_stack_fffffffffffffd58 >> 0x20));
        dVar1 = *pdVar9;
        pdVar9 = (double *)infinity();
        if (dVar1 < *pdVar9) {
          SPxLPBase<double>::lhs
                    (in_stack_fffffffffffffd60,(int)((ulong)in_stack_fffffffffffffd58 >> 0x20));
          SPxLPBase<double>::rhs
                    (in_stack_fffffffffffffd60,(int)((ulong)in_stack_fffffffffffffd58 >> 0x20));
          SPxSimplifier<double>::tolerances(in_stack_fffffffffffffd58);
          peVar10 = std::
                    __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x264328);
          Tolerances::epsilon(peVar10);
          EQ<double,double,double>
                    ((double)in_stack_fffffffffffffd60,(double)in_stack_fffffffffffffd58,
                     1.23892444823361e-317);
          std::shared_ptr<soplex::Tolerances>::~shared_ptr
                    ((shared_ptr<soplex::Tolerances> *)0x26436f);
        }
      }
    }
    for (local_68 = 0; iVar3 = local_68,
        iVar5 = SPxLPBase<double>::nCols((SPxLPBase<double> *)0x264406), iVar3 < iVar5;
        local_68 = local_68 + 1) {
      pdVar9 = SPxLPBase<double>::lower
                         (in_stack_fffffffffffffd60,(int)((ulong)in_stack_fffffffffffffd58 >> 0x20))
      ;
      dVar1 = *pdVar9;
      pdVar9 = (double *)infinity();
      if (-*pdVar9 < dVar1) {
        SPxLPBase<double>::upper
                  (in_stack_fffffffffffffd60,(int)((ulong)in_stack_fffffffffffffd58 >> 0x20));
        infinity();
      }
    }
    soplex::operator<<((SPxOut *)in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58);
    soplex::operator<<((SPxOut *)in_stack_fffffffffffffd60,
                       (int)((ulong)in_stack_fffffffffffffd58 >> 0x20));
    soplex::operator<<((SPxOut *)in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58);
    soplex::operator<<((SPxOut *)in_stack_fffffffffffffd60,
                       (int)((ulong)in_stack_fffffffffffffd58 >> 0x20));
    soplex::operator<<((SPxOut *)in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58);
    soplex::operator<<((SPxOut *)in_stack_fffffffffffffd60,
                       (int)((ulong)in_stack_fffffffffffffd58 >> 0x20));
    soplex::operator<<((SPxOut *)in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58);
    soplex::operator<<((SPxOut *)in_stack_fffffffffffffd60,
                       (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffffd58);
    (**(code **)(**(long **)(in_RDI + 0x48) + 0x10))(*(long **)(in_RDI + 0x48),&local_34);
  }
  DataArray<int>::reSize
            ((DataArray<int> *)in_stack_fffffffffffffd60,
             (int)((ulong)in_stack_fffffffffffffd58 >> 0x20));
  for (local_6c = 0; iVar3 = local_6c,
      iVar5 = DataArray<int>::size((DataArray<int> *)(in_RDI + 0x1a0)), iVar3 < iVar5;
      local_6c = local_6c + 1) {
    piVar11 = DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x1a0),local_6c);
    *piVar11 = 0;
  }
  *(undefined4 *)(in_RDI + 0x1c0) = 0;
  handleRowObjectives(in_stack_fffffffffffffe30,
                      (SPxLPBase<double> *)
                      CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  SPxLPBase<double>::nCols((SPxLPBase<double> *)0x26462d);
  VectorBase<double>::reDim
            (in_stack_fffffffffffffd90,(int)((ulong)in_stack_fffffffffffffd88 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffd88 >> 0x18,0));
  SPxLPBase<double>::nRows((SPxLPBase<double> *)0x264662);
  VectorBase<double>::reDim
            (in_stack_fffffffffffffd90,(int)((ulong)in_stack_fffffffffffffd88 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffd88 >> 0x18,0));
  SPxLPBase<double>::nRows((SPxLPBase<double> *)0x264699);
  VectorBase<double>::reDim
            (in_stack_fffffffffffffd90,(int)((ulong)in_stack_fffffffffffffd88 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffd88 >> 0x18,0));
  SPxLPBase<double>::nCols((SPxLPBase<double> *)0x2646d0);
  VectorBase<double>::reDim
            (in_stack_fffffffffffffd90,(int)((ulong)in_stack_fffffffffffffd88 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffd88 >> 0x18,0));
  SPxLPBase<double>::nCols((SPxLPBase<double> *)0x264707);
  DataArray<soplex::SPxSolverBase<double>::VarStatus>::reSize
            ((DataArray<soplex::SPxSolverBase<double>::VarStatus> *)in_stack_fffffffffffffd60,
             (int)((ulong)in_stack_fffffffffffffd58 >> 0x20));
  SPxLPBase<double>::nRows((SPxLPBase<double> *)0x264739);
  DataArray<soplex::SPxSolverBase<double>::VarStatus>::reSize
            ((DataArray<soplex::SPxSolverBase<double>::VarStatus> *)in_stack_fffffffffffffd60,
             (int)((ulong)in_stack_fffffffffffffd58 >> 0x20));
  SPxLPBase<double>::nCols((SPxLPBase<double> *)0x26476b);
  DataArray<int>::reSize
            ((DataArray<int> *)in_stack_fffffffffffffd60,
             (int)((ulong)in_stack_fffffffffffffd58 >> 0x20));
  SPxLPBase<double>::nRows((SPxLPBase<double> *)0x26479d);
  DataArray<int>::reSize
            ((DataArray<int> *)in_stack_fffffffffffffd60,
             (int)((ulong)in_stack_fffffffffffffd58 >> 0x20));
  SPxLPBase<double>::nRows((SPxLPBase<double> *)0x2647cf);
  Array<soplex::DSVectorBase<double>_>::reSize
            ((Array<soplex::DSVectorBase<double>_> *)in_stack_fffffffffffffd60,
             (int)((ulong)in_stack_fffffffffffffd58 >> 0x20));
  SPxLPBase<double>::nCols((SPxLPBase<double> *)0x264801);
  Array<soplex::DSVectorBase<double>_>::reSize
            ((Array<soplex::DSVectorBase<double>_> *)in_stack_fffffffffffffd60,
             (int)((ulong)in_stack_fffffffffffffd58 >> 0x20));
  SPxLPBase<double>::nRows((SPxLPBase<double> *)0x264833);
  Array<soplex::DSVectorBase<double>_>::reSize
            ((Array<soplex::DSVectorBase<double>_> *)in_stack_fffffffffffffd60,
             (int)((ulong)in_stack_fffffffffffffd58 >> 0x20));
  SPxLPBase<double>::nCols((SPxLPBase<double> *)0x264865);
  Array<soplex::DSVectorBase<double>_>::reSize
            ((Array<soplex::DSVectorBase<double>_> *)in_stack_fffffffffffffd60,
             (int)((ulong)in_stack_fffffffffffffd58 >> 0x20));
  *(byte *)(in_RDI + 0x1bc) = local_21 & 1;
  for (local_70 = 0; iVar3 = local_70,
      iVar6 = SPxLPBase<double>::nRows((SPxLPBase<double> *)0x2648b2), iVar5 = local_70,
      iVar3 < iVar6; local_70 = local_70 + 1) {
    piVar11 = DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x108),local_70);
    *piVar11 = iVar5;
  }
  for (local_74 = 0; iVar3 = local_74,
      iVar6 = SPxLPBase<double>::nCols((SPxLPBase<double> *)0x26492a), iVar5 = local_74,
      iVar3 < iVar6; local_74 = local_74 + 1) {
    piVar11 = DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0xf0),local_74);
    *piVar11 = iVar5;
  }
  handleExtremes(in_stack_00000060,in_stack_00000058);
  while( true ) {
    bVar12 = false;
    if ((local_29 & 1) != 0) {
      bVar12 = *(int *)(in_RDI + 0x1c4) == 0;
    }
    if (!bVar12) break;
    local_30 = local_30 + 1;
    if ((*(long *)(in_RDI + 0x48) != 0) &&
       (VVar4 = SPxOut::getVerbosity(*(SPxOut **)(in_RDI + 0x48)), 4 < (int)VVar4)) {
      local_80[2] = SPxOut::getVerbosity(*(SPxOut **)(in_RDI + 0x48));
      local_80[1] = 5;
      (**(code **)(**(long **)(in_RDI + 0x48) + 0x10))(*(long **)(in_RDI + 0x48),local_80 + 1);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffd60,
                         (int)((ulong)in_stack_fffffffffffffd58 >> 0x20));
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffd60,
                         (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffffd58);
      (**(code **)(**(long **)(in_RDI + 0x48) + 0x10))(*(long **)(in_RDI + 0x48),local_80 + 2);
    }
    local_29 = 0;
    if (*(int *)(in_RDI + 0x1c4) == 0) {
      RVar7 = simplifyRows(in_stack_00000608,in_stack_00000600,in_stack_000005f8);
      *(Result *)(in_RDI + 0x1c4) = RVar7;
    }
    if (*(int *)(in_RDI + 0x1c4) == 0) {
      RVar7 = simplifyCols(in_stack_00000628,in_stack_00000620,in_stack_00000618);
      *(Result *)(in_RDI + 0x1c4) = RVar7;
    }
    if ((local_29 & 1) == 0) {
      if (*(int *)(in_RDI + 0x1c4) == 0) {
        RVar7 = simplifyDual(in_stack_000003c8,in_stack_000003c0,in_stack_000003b8);
        *(Result *)(in_RDI + 0x1c4) = RVar7;
      }
      if ((local_29 & 1) == 0) {
        if (*(int *)(in_RDI + 0x1c4) == 0) {
          RVar7 = duplicateRows(in_stack_00000490,in_stack_00000488,in_stack_00000480);
          *(Result *)(in_RDI + 0x1c4) = RVar7;
        }
        if (*(int *)(in_RDI + 0x1c4) == 0) {
          RVar7 = duplicateCols(in_stack_00000718,in_stack_00000710,in_stack_00000708);
          *(Result *)(in_RDI + 0x1c4) = RVar7;
        }
        if ((local_29 & 1) == 0) {
          trivialHeuristic(in_stack_000001c0,in_stack_000001b8);
          propagatePseudoobj(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
          if (*(int *)(in_RDI + 0x1c4) == 0) {
            RVar7 = multiaggregation(_old_verbosity_5,_old_verbosity_6,_numRangedRows_1);
            *(Result *)(in_RDI + 0x1c4) = RVar7;
          }
        }
      }
    }
  }
  if (*(int *)(in_RDI + 0x1c4) == 0) {
    *(int *)(in_RDI + 0x20) = *(int *)(in_RDI + 0x20) - *(int *)(in_RDI + 0x1c0);
    *(int *)(in_RDI + 0x24) = *(int *)(in_RDI + 0x24) - *(int *)(in_RDI + 0x1c0);
    if ((*(long *)(in_RDI + 0x48) != 0) &&
       (VVar4 = SPxOut::getVerbosity(*(SPxOut **)(in_RDI + 0x48)), 2 < (int)VVar4)) {
      local_90[2] = SPxOut::getVerbosity(*(SPxOut **)(in_RDI + 0x48));
      local_90[1] = INFO1;
      (**(code **)(**(long **)(in_RDI + 0x48) + 0x10))(*(long **)(in_RDI + 0x48),local_90 + 1);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffd60,
                         (int)((ulong)in_stack_fffffffffffffd58 >> 0x20));
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffd60,
                         (int)((ulong)in_stack_fffffffffffffd58 >> 0x20));
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffd60,
                         (int)((ulong)in_stack_fffffffffffffd58 >> 0x20));
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffd60,
                         (int)((ulong)in_stack_fffffffffffffd58 >> 0x20));
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffd60,
                         (int)((ulong)in_stack_fffffffffffffd58 >> 0x20));
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffd60,
                         (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffffd58);
      (**(code **)(**(long **)(in_RDI + 0x48) + 0x10))(*(long **)(in_RDI + 0x48),local_90 + 2);
    }
    if ((((local_21 & 1) != 0) && (*(long *)(in_RDI + 0x48) != 0)) &&
       (VVar4 = SPxOut::getVerbosity(*(SPxOut **)(in_RDI + 0x48)), 3 < (int)VVar4)) {
      local_90[0] = SPxOut::getVerbosity(*(SPxOut **)(in_RDI + 0x48));
      local_94 = 4;
      (**(code **)(**(long **)(in_RDI + 0x48) + 0x10))(*(long **)(in_RDI + 0x48),&local_94);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffd60,
                         (int)((ulong)in_stack_fffffffffffffd58 >> 0x20));
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffd60,
                         (int)((ulong)in_stack_fffffffffffffd58 >> 0x20));
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffd60,
                         (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffffd58);
      (**(code **)(**(long **)(in_RDI + 0x48) + 0x10))(*(long **)(in_RDI + 0x48),local_90);
    }
    if ((*(long *)(in_RDI + 0x48) != 0) &&
       (VVar4 = SPxOut::getVerbosity(*(SPxOut **)(in_RDI + 0x48)), 2 < (int)VVar4)) {
      local_a0[2] = SPxOut::getVerbosity(*(SPxOut **)(in_RDI + 0x48));
      local_a0[1] = 3;
      (**(code **)(**(long **)(in_RDI + 0x48) + 0x10))(*(long **)(in_RDI + 0x48),local_a0 + 1);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58);
      SPxLPBase<double>::nRows((SPxLPBase<double> *)0x2650a3);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffd60,
                         (int)((ulong)in_stack_fffffffffffffd58 >> 0x20));
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58);
      SPxLPBase<double>::nCols((SPxLPBase<double> *)0x2650d6);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffd60,
                         (int)((ulong)in_stack_fffffffffffffd58 >> 0x20));
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58);
      SPxLPBase<double>::nNzos(in_stack_fffffffffffffd70);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffd60,
                         (int)((ulong)in_stack_fffffffffffffd58 >> 0x20));
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffd60,
                         (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffffd58);
      (**(code **)(**(long **)(in_RDI + 0x48) + 0x10))(*(long **)(in_RDI + 0x48),local_a0 + 2);
    }
    if ((*(long *)(in_RDI + 0x48) != 0) &&
       (VVar4 = SPxOut::getVerbosity(*(SPxOut **)(in_RDI + 0x48)), 3 < (int)VVar4)) {
      local_a0[0] = SPxOut::getVerbosity(*(SPxOut **)(in_RDI + 0x48));
      local_a4 = 4;
      (**(code **)(**(long **)(in_RDI + 0x48) + 0x10))(*(long **)(in_RDI + 0x48),&local_a4);
      local_a8 = 0;
      local_ac = 0;
      local_b0 = 0;
      local_b4 = 0;
      while (iVar3 = local_b4, iVar5 = SPxLPBase<double>::nRows((SPxLPBase<double> *)0x26520b),
            iVar3 < iVar5) {
        pdVar9 = SPxLPBase<double>::lhs
                           (in_stack_fffffffffffffd60,
                            (int)((ulong)in_stack_fffffffffffffd58 >> 0x20));
        dVar1 = *pdVar9;
        pdVar9 = (double *)infinity();
        if (-*pdVar9 < dVar1) {
          pdVar9 = SPxLPBase<double>::rhs
                             (in_stack_fffffffffffffd60,
                              (int)((ulong)in_stack_fffffffffffffd58 >> 0x20));
          dVar1 = *pdVar9;
          pdVar9 = (double *)infinity();
          if (dVar1 < *pdVar9) {
            SPxLPBase<double>::lhs
                      (in_stack_fffffffffffffd60,(int)((ulong)in_stack_fffffffffffffd58 >> 0x20));
            SPxLPBase<double>::rhs
                      (in_stack_fffffffffffffd60,(int)((ulong)in_stack_fffffffffffffd58 >> 0x20));
            SPxSimplifier<double>::tolerances(in_stack_fffffffffffffd58);
            peVar10 = std::
                      __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x265319);
            Tolerances::epsilon(peVar10);
            bVar12 = EQ<double,double,double>
                               ((double)in_stack_fffffffffffffd60,(double)in_stack_fffffffffffffd58,
                                1.24094073013429e-317);
            std::shared_ptr<soplex::Tolerances>::~shared_ptr
                      ((shared_ptr<soplex::Tolerances> *)0x265360);
            if (bVar12) {
              local_b0 = local_b0 + 1;
            }
            else {
              local_a8 = local_a8 + 1;
            }
          }
        }
        local_b4 = local_b4 + 1;
      }
      for (local_cc = 0; iVar3 = local_cc,
          iVar5 = SPxLPBase<double>::nCols((SPxLPBase<double> *)0x2653f7), iVar3 < iVar5;
          local_cc = local_cc + 1) {
        pdVar9 = SPxLPBase<double>::lower
                           (in_stack_fffffffffffffd60,
                            (int)((ulong)in_stack_fffffffffffffd58 >> 0x20));
        dVar1 = *pdVar9;
        pdVar9 = (double *)infinity();
        if (-*pdVar9 < dVar1) {
          pdVar9 = SPxLPBase<double>::upper
                             (in_stack_fffffffffffffd60,
                              (int)((ulong)in_stack_fffffffffffffd58 >> 0x20));
          dVar1 = *pdVar9;
          pdVar9 = (double *)infinity();
          if (dVar1 < *pdVar9) {
            local_ac = local_ac + 1;
          }
        }
      }
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffd60,
                         (int)((ulong)in_stack_fffffffffffffd58 >> 0x20));
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffd60,
                         (int)((ulong)in_stack_fffffffffffffd58 >> 0x20));
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffd60,
                         (int)((ulong)in_stack_fffffffffffffd58 >> 0x20));
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffd60,
                         (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffffd58);
      (**(code **)(**(long **)(in_RDI + 0x48) + 0x10))(*(long **)(in_RDI + 0x48),local_a0);
    }
    iVar3 = SPxLPBase<double>::nCols((SPxLPBase<double> *)0x265564);
    if ((iVar3 == 0) &&
       (iVar3 = SPxLPBase<double>::nRows((SPxLPBase<double> *)0x26557a), iVar3 == 0)) {
      if ((*(long *)(in_RDI + 0x48) != 0) &&
         (VVar4 = SPxOut::getVerbosity(*(SPxOut **)(in_RDI + 0x48)), 2 < (int)VVar4)) {
        local_d8[2] = SPxOut::getVerbosity(*(SPxOut **)(in_RDI + 0x48));
        local_d8[1] = 3;
        (**(code **)(**(long **)(in_RDI + 0x48) + 0x10))(*(long **)(in_RDI + 0x48),local_d8 + 1);
        soplex::operator<<((SPxOut *)in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58);
        soplex::operator<<((SPxOut *)in_stack_fffffffffffffd60,
                           (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffffd58);
        (**(code **)(**(long **)(in_RDI + 0x48) + 0x10))(*(long **)(in_RDI + 0x48),local_d8 + 2);
      }
      *(undefined4 *)(in_RDI + 0x1c4) = 4;
    }
    if ((*(long *)(in_RDI + 0x48) != 0) &&
       (VVar4 = SPxOut::getVerbosity(*(SPxOut **)(in_RDI + 0x48)), 3 < (int)VVar4)) {
      local_d8[0] = SPxOut::getVerbosity(*(SPxOut **)(in_RDI + 0x48));
      local_dc = 4;
      (**(code **)(**(long **)(in_RDI + 0x48) + 0x10))(*(long **)(in_RDI + 0x48),&local_dc);
      manip = soplex::operator<<((SPxOut *)in_stack_fffffffffffffd60,
                                 (char *)in_stack_fffffffffffffd58);
      DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x1a0),0);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffd60,(int)((ulong)manip >> 0x20));
      _spxout = soplex::operator<<((SPxOut *)in_stack_fffffffffffffd60,(char *)manip);
      DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x1a0),1);
      soplex::operator<<(_spxout,(int)((ulong)manip >> 0x20));
      soplex::operator<<(_spxout,(char *)manip);
      DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x1a0),2);
      soplex::operator<<(_spxout,(int)((ulong)manip >> 0x20));
      soplex::operator<<(_spxout,(char *)manip);
      DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x1a0),3);
      soplex::operator<<(_spxout,(int)((ulong)manip >> 0x20));
      soplex::operator<<(_spxout,(char *)manip);
      DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x1a0),4);
      soplex::operator<<(_spxout,(int)((ulong)manip >> 0x20));
      soplex::operator<<(_spxout,(char *)manip);
      DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x1a0),5);
      soplex::operator<<(_spxout,(int)((ulong)manip >> 0x20));
      soplex::operator<<(_spxout,(char *)manip);
      DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x1a0),6);
      soplex::operator<<(_spxout,(int)((ulong)manip >> 0x20));
      soplex::operator<<(_spxout,(char *)manip);
      DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x1a0),7);
      soplex::operator<<(_spxout,(int)((ulong)manip >> 0x20));
      soplex::operator<<(_spxout,(char *)manip);
      DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x1a0),8);
      soplex::operator<<(_spxout,(int)((ulong)manip >> 0x20));
      soplex::operator<<(_spxout,(char *)manip);
      DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x1a0),9);
      soplex::operator<<(_spxout,(int)((ulong)manip >> 0x20));
      soplex::operator<<(_spxout,(char *)manip);
      DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x1a0),10);
      soplex::operator<<(_spxout,(int)((ulong)manip >> 0x20));
      soplex::operator<<(_spxout,(char *)manip);
      DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x1a0),0xb);
      soplex::operator<<(_spxout,(int)((ulong)manip >> 0x20));
      soplex::operator<<(_spxout,(char *)manip);
      DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x1a0),0xc);
      soplex::operator<<(_spxout,(int)((ulong)manip >> 0x20));
      soplex::operator<<(_spxout,(char *)manip);
      DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x1a0),0xd);
      soplex::operator<<(_spxout,(int)((ulong)manip >> 0x20));
      soplex::operator<<(_spxout,(char *)manip);
      DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x1a0),0xe);
      soplex::operator<<(_spxout,(int)((ulong)manip >> 0x20));
      soplex::operator<<(_spxout,(char *)manip);
      DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x1a0),0xf);
      soplex::operator<<(_spxout,(int)((ulong)manip >> 0x20));
      soplex::operator<<(_spxout,(char *)manip);
      DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x1a0),0x10);
      soplex::operator<<(_spxout,(int)((ulong)manip >> 0x20));
      soplex::operator<<(_spxout,(char *)manip);
      soplex::operator<<(_spxout,(_func_ostream_ptr_ostream_ptr *)manip);
      (**(code **)(**(long **)(in_RDI + 0x48) + 0x10))(*(long **)(in_RDI + 0x48),local_d8);
    }
    (**(code **)(**(long **)(in_RDI + 0x10) + 0x20))();
    local_4 = *(Result *)(in_RDI + 0x1c4);
  }
  else {
    if ((*(long *)(in_RDI + 0x48) != 0) &&
       (VVar4 = SPxOut::getVerbosity(*(SPxOut **)(in_RDI + 0x48)), 2 < (int)VVar4)) {
      local_80[0] = SPxOut::getVerbosity(*(SPxOut **)(in_RDI + 0x48));
      local_84 = 3;
      (**(code **)(**(long **)(in_RDI + 0x48) + 0x10))(*(long **)(in_RDI + 0x48),&local_84);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffd60,
                         (int)((ulong)in_stack_fffffffffffffd58 >> 0x20));
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffd60,
                         (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffffd58);
      (**(code **)(**(long **)(in_RDI + 0x48) + 0x10))(*(long **)(in_RDI + 0x48),local_80);
    }
    local_4 = *(Result *)(in_RDI + 0x1c4);
  }
  return local_4;
}

Assistant:

typename SPxSimplifier<R>::Result SPxMainSM<R>::simplify(SPxLPBase<R>& lp, Real remainingTime,
      bool keepbounds, uint32_t seed)
{
   // transfer message handler
   this->spxout = lp.spxout;
   assert(this->spxout != nullptr);

   m_thesense = lp.spxSense();
   this->m_timeUsed->reset();
   this->m_timeUsed->start();

   this->m_objoffset = 0.0;
   m_cutoffbound = R(-infinity);
   m_pseudoobj = R(-infinity);

   this->m_remRows = 0;
   this->m_remCols = 0;
   this->m_remNzos = 0;
   this->m_chgBnds = 0;
   this->m_chgLRhs = 0;
   this->m_keptBnds = 0;
   this->m_keptLRhs = 0;

   m_result     = this->OKAY;
   bool   again = true;
   int nrounds = 0;

   if(m_hist.size() > 0)
   {
      m_hist.clear();
   }

   m_hist.reSize(0);
   m_postsolved = false;

   SPX_MSG_INFO2((*this->spxout),
                 int numRangedRows = 0;
                 int numBoxedCols = 0;
                 int numEqualities = 0;

                 for(int i = 0; i < lp.nRows(); ++i)
{
   if(lp.lhs(i) > R(-infinity) && lp.rhs(i) < R(infinity))
      {
         if(EQ(lp.lhs(i), lp.rhs(i), this->tolerances()->epsilon()))
            ++numEqualities;
         else
            ++numRangedRows;
      }
   }
   for(int j = 0; j < lp.nCols(); ++j)
   if(lp.lower(j) > R(-infinity) && lp.upper(j) < R(infinity))
      ++numBoxedCols;

      (*this->spxout) << "LP has "
                      << numEqualities << " equations, "
                      << numRangedRows << " ranged rows, "
                      << numBoxedCols << " boxed columns"
                      << std::endl;
                   )

         m_stat.reSize(17);

   for(int k = 0; k < m_stat.size(); ++k)
      m_stat[k] = 0;

   m_addedcols = 0;
   handleRowObjectives(lp);

   m_prim.reDim(lp.nCols());
   m_slack.reDim(lp.nRows());
   m_dual.reDim(lp.nRows());
   m_redCost.reDim(lp.nCols());
   m_cBasisStat.reSize(lp.nCols());
   m_rBasisStat.reSize(lp.nRows());
   m_cIdx.reSize(lp.nCols());
   m_rIdx.reSize(lp.nRows());

   m_classSetRows.reSize(lp.nRows());
   m_classSetCols.reSize(lp.nCols());
   m_dupRows.reSize(lp.nRows());
   m_dupCols.reSize(lp.nCols());

   m_keepbounds = keepbounds;

   for(int i = 0; i < lp.nRows(); ++i)
      m_rIdx[i] = i;

   for(int j = 0; j < lp.nCols(); ++j)
      m_cIdx[j] = j;

   // round extreme values (set all values smaller than this->eps to zero and all values bigger than R(infinity)/5 to R(infinity))
#if SOPLEX_EXTREMES
   handleExtremes(lp);
#endif

   // main presolving loop
   while(again && m_result == this->OKAY)
   {
      nrounds++;
      SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "Round " << nrounds << ":" << std::endl;)
      again = false;

#if SOPLEX_ROWS_SPXMAINSM

      if(m_result == this->OKAY)
         m_result = simplifyRows(lp, again);

#endif

#if SOPLEX_COLS_SPXMAINSM

      if(m_result == this->OKAY)
         m_result = simplifyCols(lp, again);

#endif

      if(again)
         continue;

#if SOPLEX_DUAL_SPXMAINSM

      if(m_result == this->OKAY)
         m_result = simplifyDual(lp, again);

#endif

      if(again)
         continue;

#if SOPLEX_DUPLICATE_ROWS

      if(m_result == this->OKAY)
         m_result = duplicateRows(lp, again);

#endif

#if SOPLEX_DUPLICATE_COLS

      if(m_result == this->OKAY)
         m_result = duplicateCols(lp, again);

#endif

      if(!again)
      {
#if SOPLEX_TRIVIAL_HEURISTICS
         trivialHeuristic(lp);
#endif

#if SOPLEX_PSEUDOOBJ
         propagatePseudoobj(lp);
#endif

#if SOPLEX_MULTI_AGGREGATE

         if(m_result == this->OKAY)
            m_result = multiaggregation(lp, again);

#endif
      }

   }

   // preprocessing detected infeasibility or unboundedness
   if(m_result != this->OKAY)
   {
      SPX_MSG_INFO1((*this->spxout), (*this->spxout) << "Simplifier result: " << static_cast<int>
                    (m_result) << std::endl;)
      return m_result;
   }

   this->m_remCols -= m_addedcols;
   this->m_remNzos -= m_addedcols;
   SPX_MSG_INFO1((*this->spxout), (*this->spxout) << "Simplifier removed "
                 << this->m_remRows << " rows, "
                 << this->m_remCols << " columns, "
                 << this->m_remNzos << " nonzeros, "
                 << this->m_chgBnds << " col bounds, "
                 << this->m_chgLRhs << " row bounds"
                 << std::endl;)

   if(keepbounds)
      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "Simplifier kept "
                    << this->m_keptBnds << " column bounds, "
                    << this->m_keptLRhs << " row bounds"
                    << std::endl;)

      SPX_MSG_INFO1((*this->spxout), (*this->spxout) << "Reduced LP has "
                    << lp.nRows() << " rows "
                    << lp.nCols() << " columns "
                    << lp.nNzos() << " nonzeros"
                    << std::endl;)

      SPX_MSG_INFO2((*this->spxout),
                    int numRangedRows = 0;
                    int numBoxedCols  = 0;
                    int numEqualities = 0;

                    for(int i = 0; i < lp.nRows(); ++i)
   {
      if(lp.lhs(i) > R(-infinity) && lp.rhs(i) < R(infinity))
         {
            if(EQ(lp.lhs(i), lp.rhs(i), this->tolerances()->epsilon()))
               ++numEqualities;
            else
               ++numRangedRows;
         }
      }
   for(int j = 0; j < lp.nCols(); ++j)
   if(lp.lower(j) > R(-infinity) && lp.upper(j) < R(infinity))
      ++numBoxedCols;

      (*this->spxout) << "Reduced LP has "
                      << numEqualities << " equations, "
                      << numRangedRows << " ranged rows, "
                      << numBoxedCols << " boxed columns"
                      << std::endl;
                   )

         if(lp.nCols() == 0 && lp.nRows() == 0)
         {
            SPX_MSG_INFO1((*this->spxout), (*this->spxout) << "Simplifier removed all rows and columns" <<
                          std::endl;)
            m_result = this->VANISHED;
         }

   SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "\nSimplifier performed:\n"
                 << m_stat[EMPTY_ROW]            << " empty rows\n"
                 << m_stat[FREE_ROW]             << " free rows\n"
                 << m_stat[SINGLETON_ROW]        << " singleton rows\n"
                 << m_stat[FORCE_ROW]            << " forcing rows\n"
                 << m_stat[EMPTY_COL]            << " empty columns\n"
                 << m_stat[FIX_COL]              << " fixed columns\n"
                 << m_stat[FREE_ZOBJ_COL]        << " free columns with zero objective\n"
                 << m_stat[ZOBJ_SINGLETON_COL]   << " singleton columns with zero objective\n"
                 << m_stat[DOUBLETON_ROW]        << " singleton columns combined with a doubleton equation\n"
                 << m_stat[FREE_SINGLETON_COL]   << " free singleton columns\n"
                 << m_stat[DOMINATED_COL]        << " dominated columns\n"
                 << m_stat[WEAKLY_DOMINATED_COL] << " weakly dominated columns\n"
                 << m_stat[DUPLICATE_ROW]        << " duplicate rows\n"
                 << m_stat[FIX_DUPLICATE_COL]    << " duplicate columns (fixed)\n"
                 << m_stat[SUB_DUPLICATE_COL]    << " duplicate columns (substituted)\n"
                 << m_stat[AGGREGATION]          << " variable aggregations\n"
                 << m_stat[MULTI_AGG]            << " multi aggregations\n"
                 << std::endl;);

   this->m_timeUsed->stop();

   return m_result;
}